

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  uint uVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  char cVar4;
  long *plVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  size_t sVar9;
  pointer pbVar10;
  string outname;
  ostringstream cmCTestLog_msg_6;
  ostringstream indexStr;
  undefined1 auStack_368 [8];
  long *local_360;
  long local_358;
  long local_350 [2];
  long *local_340;
  long local_330 [2];
  undefined1 local_320 [16];
  _func_int *local_310 [12];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  lVar8 = 3;
  if (total < 100) {
    lVar8 = 2 - (ulong)(total < 10);
  }
  if (this->NumberOfRunsLeft == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(long *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = lVar8;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2d7,(char *)local_320._0_8_,false);
    if ((_func_int **)local_320._0_8_ != local_310) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(long *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = lVar8;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2d9,(char *)local_320._0_8_,false);
    if ((_func_int **)local_320._0_8_ == local_310) goto LAB_00324671;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(long *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = lVar8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e0,(char *)local_320._0_8_,false);
    if ((_func_int **)local_320._0_8_ != local_310) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(long *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = lVar8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e3,(char *)local_320._0_8_,false);
    if ((_func_int **)local_320._0_8_ == local_310) goto LAB_00324671;
  }
  operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
LAB_00324671:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (this->TestHandler->MemCheck == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"MemCheck",8);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e7,(char *)local_320._0_8_,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Test",4);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e9,(char *)local_320._0_8_,false);
  }
  if ((_func_int **)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," #",2);
  poVar7 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  uVar1 = this->TestHandler->MaxIndex;
  lVar8 = 6;
  if (uVar1 < 100) {
    lVar8 = 5 - (ulong)(uVar1 < 10);
  }
  *(long *)((long)local_310 + (long)*(_func_int **)(local_320._0_8_ + -0x18)) = lVar8;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,(char *)local_360,local_358);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2f0,(char *)local_360,false);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2f1,(char *)local_360,false);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  iVar6 = cmCTest::GetMaxTestNameWidth(this->CTest);
  pcVar3 = (this->TestProperties->Name)._M_dataplus._M_p;
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,pcVar3,pcVar3 + (this->TestProperties->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_360);
  std::__cxx11::string::resize((ulong)&local_360,(char)iVar6 + '\x04');
  poVar7 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Testing: ",10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Test: ",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = this->TestHandler->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Command: \"",10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->ActualCommand)._M_dataplus._M_p,
                      (this->ActualCommand)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  pbVar10 = (this->Arguments).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 !=
      (this->Arguments).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar7 = this->TestHandler->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," \"",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (this->Arguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar7 = this->TestHandler->LogFile;
  cVar4 = (char)poVar7;
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar4);
  std::ostream::put(cVar4);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Directory: ",0xb);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Directory)._M_dataplus._M_p,
                      (this->TestProperties->Directory)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" start time: ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->StartTime)._M_dataplus._M_p,(this->StartTime)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = this->TestHandler->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Output:",7);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"----------------------------------------------------------",0x3a);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->TestHandler->LogFile,(this->ProcessOutput)._M_dataplus._M_p,
                      (this->ProcessOutput)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<end of output>",0xf);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  plVar5 = local_360;
  if (local_360 == (long *)0x0) {
    std::ios::clear((int)(auStack_368 + (long)*(_func_int **)(local_320._0_8_ + -0x18)) + 0x48);
  }
  else {
    sVar9 = strlen((char *)local_360);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)plVar5,sVar9);
  }
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x311,(char *)local_340,false);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Testing ",8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ... ",5);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x313,(char *)local_340,false);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  // if this is the last or only run of this test
  // then print out completed / total
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  if (this->NumberOfRunsLeft == 1) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << completed << "/");
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << total << " ");
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << " "
                 << " ");
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << " "
                 << " ");
  }

  if (this->TestHandler->MemCheck) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "MemCheck");
  } else {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "Test");
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, " ");
  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::vector<std::string>::iterator i = this->Arguments.begin();
       i != this->Arguments.end(); ++i) {
    *this->TestHandler->LogFile << " \"" << *i << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  cmCTestLog(this->CTest, HANDLER_OUTPUT, outname.c_str());
  cmCTestLog(this->CTest, DEBUG, "Testing " << this->TestProperties->Name
                                            << " ... ");
}